

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushFont(ImFont *font)

{
  ImFont **__src;
  ImGuiContext *pIVar1;
  int iVar2;
  ImFont **__dest;
  int iVar3;
  int iVar4;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((font == (ImFont *)0x0) && (font = (GImGui->IO).FontDefault, font == (ImFont *)0x0)) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  iVar2 = (pIVar1->FontStack).Size;
  if (iVar2 == (pIVar1->FontStack).Capacity) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    iVar4 = iVar2 + 1;
    if (iVar2 + 1 < iVar3) {
      iVar4 = iVar3;
    }
    __dest = (ImFont **)MemAlloc((long)iVar4 << 3);
    __src = (pIVar1->FontStack).Data;
    if (__src != (ImFont **)0x0) {
      memcpy(__dest,__src,(long)(pIVar1->FontStack).Size << 3);
      MemFree((pIVar1->FontStack).Data);
    }
    (pIVar1->FontStack).Data = __dest;
    (pIVar1->FontStack).Capacity = iVar4;
    iVar2 = (pIVar1->FontStack).Size;
  }
  else {
    __dest = (pIVar1->FontStack).Data;
  }
  __dest[iVar2] = font;
  (pIVar1->FontStack).Size = (pIVar1->FontStack).Size + 1;
  ImDrawList::PushTextureID(pIVar1->CurrentWindow->DrawList,font->ContainerAtlas->TexID);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}